

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O0

void * __thiscall
Diligent::FixedBlockMemoryAllocator::MemoryPage::GetBlockStartAddress
          (MemoryPage *this,Uint32 BlockIndex)

{
  Char *pCVar1;
  char (*in_RCX) [29];
  undefined1 local_68 [8];
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  Uint32 BlockIndex_local;
  MemoryPage *this_local;
  
  msg.field_2._12_4_ = BlockIndex;
  if (this->m_pOwnerAllocator == (FixedBlockMemoryAllocator *)0x0) {
    FormatString<char[26],char[29]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pOwnerAllocator != nullptr",in_RCX);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"GetBlockStartAddress",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x54);
    std::__cxx11::string::~string((string *)local_38);
  }
  if (this->m_pOwnerAllocator->m_NumBlocksInPage <= (uint)msg.field_2._12_4_) {
    FormatString<char[20]>((string *)local_68,(char (*) [20])"Invalid block index");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"GetBlockStartAddress",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x55);
    std::__cxx11::string::~string((string *)local_68);
  }
  return (void *)((long)this->m_pPageStart +
                 (ulong)(uint)msg.field_2._12_4_ * this->m_pOwnerAllocator->m_BlockSize);
}

Assistant:

void* FixedBlockMemoryAllocator::MemoryPage::GetBlockStartAddress(Uint32 BlockIndex) const
{
    VERIFY_EXPR(m_pOwnerAllocator != nullptr);
    VERIFY(BlockIndex < m_pOwnerAllocator->m_NumBlocksInPage, "Invalid block index");
    return reinterpret_cast<Uint8*>(m_pPageStart) + BlockIndex * m_pOwnerAllocator->m_BlockSize;
}